

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

int __thiscall
RuntimeVariableSymbol::clone
          (RuntimeVariableSymbol *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TypeName *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  int iVar1;
  RuntimeVariableSymbol *this_00;
  
  this_00 = this;
  std::
  make_shared<RuntimeVariableSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<ExpressionNode>const&,Context_const&>
            (in_stack_00000008,unaff_retaddr,(shared_ptr<ExpressionNode> *)this,(Context *)__fn);
  std::shared_ptr<RuntimeSymbol>::shared_ptr<RuntimeVariableSymbol,void>
            ((shared_ptr<RuntimeSymbol> *)this_00,(shared_ptr<RuntimeVariableSymbol> *)this);
  iVar1 = (int)this_00;
  std::shared_ptr<RuntimeVariableSymbol>::~shared_ptr((shared_ptr<RuntimeVariableSymbol> *)0x150d6d)
  ;
  return iVar1;
}

Assistant:

std::shared_ptr<RuntimeSymbol> RuntimeVariableSymbol::clone(const Context& context) const
{
  return std::make_shared<RuntimeVariableSymbol>(name_, type_, value_, context);
}